

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_31324d::Handlers::setupReplaceInput::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this)

{
  element_type *this_00;
  anon_class_8_1_8991fb9c *this_local;
  
  this_00 = std::__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->this->c_main);
  QPDFJob::Config::replaceInput(this_00);
  return;
}

Assistant:

void
Handlers::beginEncrypt(JSON j)
{
    // This method is only called if the overall JSON structure matches the schema, so we already
    // know that keys that are present have the right types.
    int key_len = 0;
    std::string user_password;
    std::string owner_password;
    bool user_password_seen = false;
    bool owner_password_seen = false;
    j.forEachDictItem([&](std::string const& key, JSON value) {
        if ((key == "40bit") || (key == "128bit") || (key == "256bit")) {
            if (key_len != 0) {
                QTC::TC("qpdf", "QPDFJob json encrypt duplicate key length");
                usage("exactly one of 40bit, 128bit, or 256bit must be given");
            }
            key_len = QUtil::string_to_int(key.c_str());
        } else if (key == "userPassword") {
            user_password_seen = value.getString(user_password);
        } else if (key == "ownerPassword") {
            owner_password_seen = value.getString(owner_password);
        }
    });
    if (key_len == 0) {
        QTC::TC("qpdf", "QPDFJob json encrypt no key length");
        usage(
            "exactly one of 40bit, 128bit, or 256bit must be given; an empty dictionary may be "
            "supplied for one of them to set the key length without imposing any restrictions");
    }
    if (!(user_password_seen && owner_password_seen)) {
        QTC::TC("qpdf", "QPDFJob json encrypt missing password");
        usage(
            "the user and owner password are both required; use the empty string for the user "
            "password if you don't want a password");
    }
    this->c_enc = c_main->encrypt(key_len, user_password, owner_password);
}